

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O0

void __thiscall N::histo(N *this,Alg<void> *alg,vector<N_*,_std::allocator<N_*>_> *line)

{
  bool bVar1;
  iterator this_00;
  N *in_RDX;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_RDI;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff28;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff30;
  anon_class_56_2_7ce43dd9 *this_01;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> __first;
  N *in_stack_ffffffffffffff50;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff78;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff80;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> f;
  
  __first._M_current = (N **)in_RDX;
  std::vector<N_*,_std::allocator<N_*>_>::begin(in_stack_ffffffffffffff28);
  this_00 = std::vector<N_*,_std::allocator<N_*>_>::end(in_stack_ffffffffffffff28);
  f._M_current = in_RDI._M_current;
  std::find<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N*>
            (__first,in_RDI,(N **)in_RDX);
  std::vector<N_*,_std::allocator<N_*>_>::end(in_stack_ffffffffffffff28);
  bVar1 = __gnu_cxx::operator==<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>
                    ((__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                     in_stack_ffffffffffffff30,
                     (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
                     in_stack_ffffffffffffff28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<N_*,_std::allocator<N_*>_>::push_back
              (in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
    all(in_stack_ffffffffffffff50);
    this_01 = (anon_class_56_2_7ce43dd9 *)&stack0xffffffffffffff60;
    std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::function
              ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)in_RDI._M_current,
               (function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)in_RDX);
    std::vector<N_*,_std::allocator<N_*>_>::vector
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    foreach<N::histo(std::function<void(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)::_lambda(N*)_1_>
              ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)this_00._M_current,(anon_class_56_2_7ce43dd9 *)f._M_current);
    histo(std::function<void(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)
    ::{lambda(N*)#1}::~function(this_01);
    std::vector<N_*,_std::allocator<N_*>_>::pop_back((vector<N_*,_std::allocator<N_*>_> *)0x17d438);
    std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()
              ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)in_RDI._M_current,
               in_RDX,(vector<N_*,_std::allocator<N_*>_> *)this_01);
  }
  else {
    std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::operator()
              ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)in_RDI._M_current,
               in_RDX,in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void histo(const alg::Alg<void>& alg, vector<N*> line = {}) {
        if (find(line.begin(), line.end(), this) != line.end()) return alg(*this, line);
        line.push_back(this);

        this->all().foreach([alg, line](N* n){n->histo(alg, line);});

        line.pop_back();
        return alg(*this, line);
    }